

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

uint uv__utf8_decode1_slow(char **p,char *pe,uint a)

{
  byte *pbVar1;
  long lVar2;
  uint local_34;
  uint local_30;
  uint min;
  uint d;
  uint c;
  uint b;
  uint a_local;
  char *pe_local;
  char **p_local;
  
  if (0xf7 < a) {
    return 0xffffffff;
  }
  lVar2 = (long)pe - (long)*p;
  if (pe == *p) {
LAB_00109fdd:
    p_local._4_4_ = 0xffffffff;
  }
  else {
    if (lVar2 == 1) {
LAB_00109f96:
      if (a < 0xc0) goto LAB_00109fdd;
      local_34 = 0x80;
      d = 0x80;
      min = a & 0x1f | 0x80;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      local_30 = (uint)*pbVar1;
      c = 0;
    }
    else if ((lVar2 == 2) || (a < 0xf0)) {
      if (a < 0xe0) goto LAB_00109f96;
      local_34 = 0x800;
      d = a & 0xf | 0x80;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      min = (uint)*pbVar1;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      local_30 = (uint)*pbVar1;
      c = 0;
    }
    else {
      local_34 = 0x10000;
      c = a & 7;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      d = (uint)*pbVar1;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      min = (uint)*pbVar1;
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      local_30 = (uint)*pbVar1;
    }
    if (((d ^ min ^ local_30) & 0xc0) == 0x80) {
      p_local._4_4_ = c << 0x12 | (d & 0x3f) << 0xc | (min & 0x3f) << 6 | local_30 & 0x3f;
      if (p_local._4_4_ < local_34) {
        p_local._4_4_ = 0xffffffff;
      }
      else if (p_local._4_4_ < 0x110000) {
        if ((0xd7ff < p_local._4_4_) && (p_local._4_4_ < 0xe000)) {
          p_local._4_4_ = 0xffffffff;
        }
      }
      else {
        p_local._4_4_ = 0xffffffff;
      }
    }
    else {
      p_local._4_4_ = 0xffffffff;
    }
  }
  return p_local._4_4_;
}

Assistant:

static unsigned uv__utf8_decode1_slow(const char** p,
                                      const char* pe,
                                      unsigned a) {
  unsigned b;
  unsigned c;
  unsigned d;
  unsigned min;

  if (a > 0xF7)
    return -1;

  switch (pe - *p) {
  default:
    if (a > 0xEF) {
      min = 0x10000;
      a = a & 7;
      b = (unsigned char) *(*p)++;
      c = (unsigned char) *(*p)++;
      d = (unsigned char) *(*p)++;
      break;
    }
    /* Fall through. */
  case 2:
    if (a > 0xDF) {
      min = 0x800;
      b = 0x80 | (a & 15);
      c = (unsigned char) *(*p)++;
      d = (unsigned char) *(*p)++;
      a = 0;
      break;
    }
    /* Fall through. */
  case 1:
    if (a > 0xBF) {
      min = 0x80;
      b = 0x80;
      c = 0x80 | (a & 31);
      d = (unsigned char) *(*p)++;
      a = 0;
      break;
    }
    /* Fall through. */
  case 0:
    return -1;  /* Invalid continuation byte. */
  }

  if (0x80 != (0xC0 & (b ^ c ^ d)))
    return -1;  /* Invalid sequence. */

  b &= 63;
  c &= 63;
  d &= 63;
  a = (a << 18) | (b << 12) | (c << 6) | d;

  if (a < min)
    return -1;  /* Overlong sequence. */

  if (a > 0x10FFFF)
    return -1;  /* Four-byte sequence > U+10FFFF. */

  if (a >= 0xD800 && a <= 0xDFFF)
    return -1;  /* Surrogate pair. */

  return a;
}